

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preEnd__modifier
          (ColladaParserAutoGen15Private *this)

{
  byte bVar1;
  bool bVar2;
  ENUM__fx_modifier_enum EVar3;
  _func_unsigned_long_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *in_RDI;
  pair<unsigned_long,_COLLADASaxFWL15::ENUM__fx_modifier_enum> *unaff_retaddr;
  bool *in_stack_00000008;
  ParserChar *in_stack_00000010;
  bool returnValue;
  ENUM__fx_modifier_enum parameter;
  bool failed;
  ParserChar *in_stack_000000c8;
  ParserChar *in_stack_000000d0;
  StringHash in_stack_000000d8;
  ErrorType in_stack_000000e0;
  Severity in_stack_000000e4;
  ParserTemplateBase *in_stack_000000e8;
  bool local_11;
  uint in_stack_fffffffffffffff4;
  
  EVar3 = GeneratedSaxParser::Utils::
          toEnum<COLLADASaxFWL15::ENUM__fx_modifier_enum,_unsigned_long,_(COLLADASaxFWL15::ENUM__fx_modifier_enum)7>
                    (_parameter,in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI);
  if ((in_stack_fffffffffffffff4 & 0x1000000) == 0) {
    bVar1 = (**(code **)(**(long **)(in_RDI + 0x108) + 0xb68))(*(long **)(in_RDI + 0x108),EVar3);
  }
  else {
    bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                      (in_stack_000000e8,in_stack_000000e4,in_stack_000000e0,in_stack_000000d8,
                       in_stack_000000d0,in_stack_000000c8);
    bVar1 = bVar2 ^ 0xff;
  }
  local_11 = (bool)(bVar1 & 1);
  if (*(long *)(in_RDI + 0x90) != 0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject
              ((StackMemoryManager *)CONCAT44(in_stack_fffffffffffffff4,EVar3));
  }
  *(undefined8 *)(in_RDI + 0x90) = 0;
  *(undefined8 *)(in_RDI + 0x98) = 0;
  return local_11;
}

Assistant:

bool ColladaParserAutoGen15Private::_preEnd__modifier()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__modifier();
        if ( !validationResult ) return false;

    } // validation
#endif

bool failed;
ENUM__fx_modifier_enum parameter = Utils::toEnum<ENUM__fx_modifier_enum, StringHash, ENUM__fx_modifier_enum__COUNT>((const ParserChar**)&mLastIncompleteFragmentInCharacterData, mEndOfDataInCurrentObjectOnStack, failed, ENUM__fx_modifier_enumMap, Utils::calculateStringHash);
bool returnValue;
if (!failed)
{
    returnValue = mImpl->data__modifier(parameter);
}
else
    returnValue = !handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_TEXTDATA_PARSING_FAILED, HASH_ELEMENT_MODIFIER, (const ParserChar*)0, mLastIncompleteFragmentInCharacterData);
if (mLastIncompleteFragmentInCharacterData)
    mStackMemoryManager.deleteObject();
mLastIncompleteFragmentInCharacterData = 0;
mEndOfDataInCurrentObjectOnStack = 0;
return returnValue;

}